

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IndexRollback(Fts5Index *p)

{
  sqlite3_blob *pBlob;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  
  pBlob = p->pReader;
  if (pBlob != (sqlite3_blob *)0x0) {
    p->pReader = (sqlite3_blob *)0x0;
    in_EAX = sqlite3_blob_close(pBlob);
  }
  if (p->pHash != (Fts5Hash *)0x0) {
    sqlite3Fts5HashClear(p->pHash);
    p->nPendingData = 0;
    in_EAX = extraout_EAX;
  }
  if (p->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(p->pStruct);
    p->pStruct = (Fts5Structure *)0x0;
    in_EAX = extraout_EAX_00;
  }
  return in_EAX;
}

Assistant:

static int sqlite3Fts5IndexRollback(Fts5Index *p){
  fts5CloseReader(p);
  fts5IndexDiscardData(p);
  fts5StructureInvalidate(p);
  /* assert( p->rc==SQLITE_OK ); */
  return SQLITE_OK;
}